

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

double Catch::Benchmark::Detail::outlier_variance
                 (Estimate<double> mean,Estimate<double> stddev,int n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  anon_class_32_4_9b8c116d local_30;
  
  dVar1 = (double)n;
  dVar3 = (mean.point / dVar1) * 0.5;
  dVar7 = dVar3 * 0.25;
  if (dVar1 < 0.0) {
    dVar2 = sqrt(dVar1);
  }
  else {
    dVar2 = SQRT(dVar1);
  }
  dVar6 = stddev.point / dVar2;
  if (dVar7 <= stddev.point / dVar2) {
    dVar6 = dVar7;
  }
  dVar2 = stddev.point * stddev.point;
  dVar6 = dVar6 * dVar6;
  local_30.n = n;
  local_30.mn = mean.point / dVar1;
  local_30.sb2 = dVar2;
  local_30.sg2 = dVar6;
  dVar7 = outlier_variance::anon_class_32_4_9b8c116d::operator()(&local_30,0.0);
  dVar3 = outlier_variance::anon_class_32_4_9b8c116d::operator()(&local_30,dVar3);
  if (dVar7 <= dVar3) {
    dVar3 = dVar7;
  }
  auVar4._0_8_ = dVar1 - dVar3;
  auVar4._8_8_ = dVar1 + -1.0;
  auVar5._8_8_ = dVar1;
  auVar5._0_8_ = dVar1;
  auVar5 = divpd(auVar4,auVar5);
  dVar3 = (dVar2 - dVar6 * auVar4._0_8_) * auVar5._0_8_;
  dVar1 = (dVar2 - dVar6 * (dVar1 + -1.0)) * auVar5._8_8_;
  if (dVar1 <= dVar3) {
    dVar3 = dVar1;
  }
  return dVar3 / dVar2;
}

Assistant:

double outlier_variance(Estimate<double> mean, Estimate<double> stddev, int n) {
                double sb = stddev.point;
                double mn = mean.point / n;
                double mg_min = mn / 2.;
                double sg = (std::min)(mg_min / 4., sb / std::sqrt(n));
                double sg2 = sg * sg;
                double sb2 = sb * sb;

                auto c_max = [n, mn, sb2, sg2](double x) -> double {
                    double k = mn - x;
                    double d = k * k;
                    double nd = n * d;
                    double k0 = -n * nd;
                    double k1 = sb2 - n * sg2 + nd;
                    double det = k1 * k1 - 4 * sg2 * k0;
                    return (int)(-2. * k0 / (k1 + std::sqrt(det)));
                };

                auto var_out = [n, sb2, sg2](double c) {
                    double nc = n - c;
                    return (nc / n) * (sb2 - nc * sg2);
                };

                return (std::min)(var_out(1), var_out((std::min)(c_max(0.), c_max(mg_min)))) / sb2;
            }